

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cRGB,cBGRA,bModulate>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  FSpecialColormap *pFVar4;
  EBlend EVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  byte *pbVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  
  pFVar4 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar5 = BLEND_NONE;
  }
  else {
    EVar5 = inf->blend;
  }
  switch(EVar5) {
  case BLEND_NONE:
    if (0 < count) {
      pbVar9 = pin + 2;
      lVar6 = 0;
      do {
        pout[lVar6 * 4 + 2] = (BYTE)(((uint)pout[lVar6 * 4 + 2] * (uint)pbVar9[-2]) / 0xff);
        pout[lVar6 * 4 + 1] = (BYTE)(((uint)pout[lVar6 * 4 + 1] * (uint)pbVar9[-1]) / 0xff);
        pout[lVar6 * 4] = (BYTE)(((uint)pout[lVar6 * 4] * (uint)*pbVar9) / 0xff);
        pout[lVar6 * 4 + 3] = 0xff;
        lVar6 = lVar6 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pbVar9 = pin + 2;
      lVar6 = 0;
      do {
        uVar11 = (uint)pbVar9[-1] * 0x8f + (uint)pbVar9[-2] * 0x4d +
                 ((uint)*pbVar9 + (uint)*pbVar9 * 8) * 4 >> 0xc;
        pout[lVar6 * 4 + 2] =
             (BYTE)(((uint)pout[lVar6 * 4 + 2] * (uint)IcePalette[uVar11][0]) / 0xff);
        pout[lVar6 * 4 + 1] =
             (BYTE)(((uint)pout[lVar6 * 4 + 1] * (uint)IcePalette[uVar11][1]) / 0xff);
        pout[lVar6 * 4] = (BYTE)(((uint)pout[lVar6 * 4] * (uint)IcePalette[uVar11][2]) / 0xff);
        pout[lVar6 * 4 + 3] = 0xff;
        lVar6 = lVar6 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pbVar9 = pin + 2;
      lVar6 = 0;
      do {
        iVar10 = inf->blendcolor[3];
        bVar1 = pbVar9[-1];
        iVar8 = inf->blendcolor[1];
        bVar2 = *pbVar9;
        iVar13 = inf->blendcolor[2];
        pout[lVar6 * 4 + 2] =
             (BYTE)(((uint)pout[lVar6 * 4 + 2] *
                    ((uint)pbVar9[-2] * iVar10 + inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
        pout[lVar6 * 4 + 1] =
             (BYTE)(((uint)pout[lVar6 * 4 + 1] * ((uint)bVar1 * iVar10 + iVar8 >> 0x10 & 0xff)) /
                   0xff);
        pout[lVar6 * 4] =
             (BYTE)(((uint)pout[lVar6 * 4] * ((uint)bVar2 * iVar10 + iVar13 >> 0x10 & 0xff)) / 0xff)
        ;
        pout[lVar6 * 4 + 3] = 0xff;
        lVar6 = lVar6 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pbVar9 = pin + 2;
      lVar6 = 0;
      do {
        bVar1 = pbVar9[-1];
        iVar10 = inf->blendcolor[1];
        bVar2 = *pbVar9;
        iVar8 = inf->blendcolor[2];
        pout[lVar6 * 4 + 2] =
             (BYTE)(((uint)pout[lVar6 * 4 + 2] *
                    ((uint)pbVar9[-2] * inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
        pout[lVar6 * 4 + 1] =
             (BYTE)(((uint)pout[lVar6 * 4 + 1] * ((uint)bVar1 * iVar10 >> 0x10 & 0xff)) / 0xff);
        pout[lVar6 * 4] =
             (BYTE)(((uint)pout[lVar6 * 4] * ((uint)bVar2 * iVar8 >> 0x10 & 0xff)) / 0xff);
        pout[lVar6 * 4 + 3] = 0xff;
        lVar6 = lVar6 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar6);
    }
    break;
  default:
    EVar5 = inf->blend;
    lVar6 = (long)EVar5;
    if (lVar6 < 0x21) {
      if ((BLEND_ICEMAP < EVar5) && (0 < count)) {
        iVar10 = 0x20 - EVar5;
        pbVar9 = pin + 2;
        lVar6 = 0;
        do {
          bVar1 = *pbVar9;
          iVar8 = ((uint)pbVar9[-1] * 0x8f + (uint)pbVar9[-2] * 0x4d +
                   ((uint)bVar1 + (uint)bVar1 * 8) * 4 >> 8) * (EVar5 + BLEND_MODULATE);
          iVar13 = (uint)pbVar9[-2] * iVar10 + iVar8;
          iVar14 = (uint)pbVar9[-1] * iVar10 + iVar8;
          iVar8 = (uint)bVar1 * iVar10 + iVar8;
          pout[lVar6 * 4 + 2] =
               (BYTE)(((uint)pout[lVar6 * 4 + 2] *
                      ((uint)((ulong)((long)iVar13 * 0x84210843) >> 0x24) - (iVar13 >> 0x1f) & 0xff)
                      ) / 0xff);
          pout[lVar6 * 4 + 1] =
               (BYTE)(((uint)pout[lVar6 * 4 + 1] *
                      ((uint)((ulong)((long)iVar14 * 0x84210843) >> 0x24) - (iVar14 >> 0x1f) & 0xff)
                      ) / 0xff);
          pout[lVar6 * 4] =
               (BYTE)(((uint)pout[lVar6 * 4] *
                      ((uint)((ulong)((long)iVar8 * 0x84210843) >> 0x24) - (iVar8 >> 0x1f) & 0xff))
                     / 0xff);
          pout[lVar6 * 4 + 3] = 0xff;
          lVar6 = lVar6 + 1;
          pbVar9 = pbVar9 + step;
        } while (count != (int)lVar6);
      }
    }
    else if (0 < count) {
      pbVar9 = pin + 2;
      lVar12 = 0;
      do {
        uVar11 = (uint)pbVar9[-1] * 0x8f + (uint)pbVar9[-2] * 0x4d +
                 ((uint)*pbVar9 + (uint)*pbVar9 * 8) * 4;
        uVar3 = uVar11 >> 8;
        uVar7 = (ulong)uVar3;
        if (0xfe < uVar3) {
          uVar7 = 0xff;
        }
        if (uVar11 < 0x100) {
          uVar7 = 0;
        }
        bVar1 = *(byte *)((long)pFVar4 + uVar7 * 4 + lVar6 * 0x518 + -0xa700);
        bVar2 = *(byte *)((long)pFVar4 + uVar7 * 4 + lVar6 * 0x518 + -0xa6ff);
        pout[lVar12 * 4 + 2] =
             (BYTE)(((uint)pout[lVar12 * 4 + 2] *
                    (uint)*(byte *)((long)pFVar4 + uVar7 * 4 + lVar6 * 0x518 + -0xa6fe)) / 0xff);
        pout[lVar12 * 4 + 1] = (BYTE)(((uint)pout[lVar12 * 4 + 1] * (uint)bVar2) / 0xff);
        pout[lVar12 * 4] = (BYTE)(((uint)pout[lVar12 * 4] * (uint)bVar1) / 0xff);
        pout[lVar12 * 4 + 3] = 0xff;
        lVar12 = lVar12 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar12);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}